

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O0

FailCodeType __thiscall
mittens::
GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/4_multi_catch.cpp:39:50)>
::runAction(GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_4_multi_catch_cpp:39:50)>
            *this,bad_alloc *e)

{
  bad_alloc *e_local;
  GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_4_multi_catch_cpp:39:50)>
  *this_local;
  
  anon_class_1_0_00000001_for_customAction_::operator()
            ((anon_class_1_0_00000001_for_customAction_ *)&this->field_0x5,e);
  return this->failCode_;
}

Assistant:

FailCodeType runAction(ExceptionType& e, std::false_type)
      {
         customAction_(e);
         return failCode_;
      }